

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::get_type_address_space_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t id,bool argument
          )

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  ExecutionModel EVar4;
  int iVar5;
  SPIRVariable *var;
  Bitset *pBVar6;
  undefined4 in_register_0000000c;
  char **ppcVar7;
  uint *ts_1;
  undefined7 uVar8;
  char *pcVar9;
  char *__s1;
  bool bVar10;
  allocator local_b9;
  uint32_t local_b8;
  uint32_t local_b4;
  char *addr_space;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a8;
  Bitset flags;
  
  ppcVar7 = (char **)CONCAT44(in_register_0000000c,id);
  flags.lower = 0;
  flags.higher._M_h._M_buckets = &flags.higher._M_h._M_single_bucket;
  flags.higher._M_h._M_bucket_count = 1;
  flags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flags.higher._M_h._M_element_count = 0;
  flags.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  flags.higher._M_h._M_rehash_policy._M_next_resize = 0;
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  var = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id);
  if (((var == (SPIRVariable *)0x0) || (type->basetype != Struct)) ||
     ((bVar1 = Compiler::has_decoration
                         ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
      !bVar1 && (bVar1 = Compiler::has_decoration
                                   ((Compiler *)this,(ID)(type->super_IVariant).self.id,
                                    DecorationBufferBlock), !bVar1)))) {
    pBVar6 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    Bitset::operator=(&flags,pBVar6);
  }
  else {
    Compiler::get_buffer_block_flags((Bitset *)&addr_space,(Compiler *)this,(VariableID)id);
    Bitset::operator=(&flags,(Bitset *)&addr_space);
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_a8);
  }
  addr_space = (char *)0x0;
  ts_1 = &switchD_001ac45e::switchdataD_002b0ab0;
  switch(type->storage) {
  case StorageClassUniformConstant:
  case StorageClassUniform:
  case StorageClassPushConstant:
    if (type->basetype == Struct) {
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBufferBlock);
      ts_1 = (uint *)0x2b4d63;
      pcVar9 = "const device";
      if (((uint)flags.lower >> 0x18 & 1) == 0) {
        pcVar9 = "device";
      }
      __s1 = "constant";
      addr_space = "constant";
      if (bVar1) {
        __s1 = pcVar9;
        addr_space = pcVar9;
      }
      goto LAB_001ac6cb;
    }
    if (!argument) {
      __s1 = "constant";
      addr_space = "constant";
      goto LAB_001ac6cb;
    }
    if (((type->basetype == Image) && ((type->image).dim == DimSubpassData)) &&
       ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
      __s1 = "";
      addr_space = "";
      goto LAB_001ac6cb;
    }
    break;
  case StorageClassInput:
    bVar1 = is_tesc_shader(this);
    uVar8 = (undefined7)((ulong)ts_1 >> 8);
    if ((bVar1 && var != (SPIRVariable *)0x0) &&
       ((var->basevariable).id == (this->stage_in_ptr_var_id).id)) {
      __s1 = "threadgroup";
      addr_space = __s1;
      if ((this->msl_options).multi_patch_workgroup != false) {
        __s1 = "const device";
        addr_space = __s1;
      }
    }
    else {
      __s1 = (char *)0x0;
    }
    bVar1 = is_tese_shader(this);
    ts_1 = (uint *)CONCAT71(uVar8,var != (SPIRVariable *)0x0);
    if (((bVar1 && var != (SPIRVariable *)0x0) & (this->msl_options).raw_buffer_tese_input) == 1) {
      local_b4 = (var->basevariable).id;
      local_b8 = (this->stage_in_ptr_var_id).id;
      bVar1 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPatch);
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      uVar3 = Compiler::get_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
      bVar10 = uVar3 - 0xb < 2;
      ts_1 = (uint *)(ulong)local_b8;
      if ((local_b4 == local_b8) ||
         (ts_1 = (uint *)(ulong)CONCAT31((int3)(local_b8 >> 8),bVar2 && bVar10),
         bVar1 && (!bVar2 || !bVar10))) {
        __s1 = "const device";
        addr_space = "const device";
      }
    }
    EVar4 = Compiler::get_execution_model((Compiler *)this);
    if (((var != (SPIRVariable *)0x0) && (EVar4 == ExecutionModelFragment)) &&
       ((var->basevariable).id == (this->stage_in_var_id).id)) {
LAB_001ac663:
      __s1 = "thread";
      addr_space = "thread";
      goto LAB_001ac6cb;
    }
    if (__s1 != (char *)0x0) goto LAB_001ac6cb;
    break;
  case StorageClassOutput:
    if (this->capture_output_to_buffer == true) {
      if (var != (SPIRVariable *)0x0) {
        bVar1 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
        if (bVar1) {
          bVar1 = Compiler::is_tessellation_shader((Compiler *)this);
          if (!bVar1) goto LAB_001ac663;
        }
        else {
          iVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,var,4);
          if ((char)iVar5 == '\0') goto LAB_001ac6bf;
        }
switchD_001ac45e_caseD_4:
        __s1 = "threadgroup";
        addr_space = "threadgroup";
        goto LAB_001ac6cb;
      }
      goto LAB_001ac6bf;
    }
    break;
  case StorageClassWorkgroup:
    goto switchD_001ac45e_caseD_4;
  case StorageClassCrossWorkgroup:
  case StorageClassPrivate:
  case StorageClassFunction:
  case StorageClassGeneric:
  case StorageClassAtomicCounter:
  case StorageClassImage:
    break;
  case StorageClassStorageBuffer:
switchD_001ac45e_caseD_c:
    if ((var == (SPIRVariable *)0x0) ||
       (bVar1 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type->super_IVariant).self.id,DecorationBlock),
       bVar1)) {
      __s1 = "const device";
      addr_space = "const device";
      if ((flags.lower & 0x1000000) == 0) {
        __s1 = "device";
        addr_space = "device";
      }
      goto LAB_001ac6cb;
    }
LAB_001ac6bf:
    __s1 = "device";
    addr_space = "device";
    goto LAB_001ac6cb;
  default:
    ts_1 = (uint *)ppcVar7;
    if (type->storage == StorageClassPhysicalStorageBuffer) goto switchD_001ac45e_caseD_c;
  }
  ts_1 = (uint *)0x2a9b09;
  __s1 = "";
  if (type->basetype == ControlPointArray) {
    __s1 = "thread";
  }
  if (!argument) {
    __s1 = "";
  }
  addr_space = __s1;
  if (type->pointer != false) {
    __s1 = "thread";
    addr_space = "thread";
  }
LAB_001ac6cb:
  if (((flags.lower & 0xa00000) == 0) || (iVar5 = strcmp(__s1,"thread"), iVar5 == 0)) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,__s1,&local_b9);
  }
  else {
    join<char_const(&)[10],char_const*&>
              (__return_storage_ptr__,(spirv_cross *)"volatile ",(char (*) [10])&addr_space,
               (char **)ts_1);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::get_type_address_space(const SPIRType &type, uint32_t id, bool argument)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && type.basetype == SPIRType::Struct &&
	    (has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock)))
		flags = get_buffer_block_flags(id);
	else
		flags = get_decoration_bitset(id);

	const char *addr_space = nullptr;
	switch (type.storage)
	{
	case StorageClassWorkgroup:
		addr_space = "threadgroup";
		break;

	case StorageClassStorageBuffer:
	case StorageClassPhysicalStorageBuffer:
	{
		// For arguments from variable pointers, we use the write count deduction, so
		// we should not assume any constness here. Only for global SSBOs.
		bool readonly = false;
		if (!var || has_decoration(type.self, DecorationBlock))
			readonly = flags.get(DecorationNonWritable);

		addr_space = readonly ? "const device" : "device";
		break;
	}

	case StorageClassUniform:
	case StorageClassUniformConstant:
	case StorageClassPushConstant:
		if (type.basetype == SPIRType::Struct)
		{
			bool ssbo = has_decoration(type.self, DecorationBufferBlock);
			if (ssbo)
				addr_space = flags.get(DecorationNonWritable) ? "const device" : "device";
			else
				addr_space = "constant";
		}
		else if (!argument)
		{
			addr_space = "constant";
		}
		else if (type_is_msl_framebuffer_fetch(type))
		{
			// Subpass inputs are passed around by value.
			addr_space = "";
		}
		break;

	case StorageClassFunction:
	case StorageClassGeneric:
		break;

	case StorageClassInput:
		if (is_tesc_shader() && var && var->basevariable == stage_in_ptr_var_id)
			addr_space = msl_options.multi_patch_workgroup ? "const device" : "threadgroup";
		// Don't pass tessellation levels in the device AS; we load and convert them
		// to float manually.
		if (is_tese_shader() && msl_options.raw_buffer_tese_input && var)
		{
			bool is_stage_in = var->basevariable == stage_in_ptr_var_id;
			bool is_patch_stage_in = has_decoration(var->self, DecorationPatch);
			bool is_builtin = has_decoration(var->self, DecorationBuiltIn);
			BuiltIn builtin = (BuiltIn)get_decoration(var->self, DecorationBuiltIn);
			bool is_tess_level = is_builtin && (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner);
			if (is_stage_in || (is_patch_stage_in && !is_tess_level))
				addr_space = "const device";
		}
		if (get_execution_model() == ExecutionModelFragment && var && var->basevariable == stage_in_var_id)
			addr_space = "thread";
		break;

	case StorageClassOutput:
		if (capture_output_to_buffer)
		{
			if (var && type.storage == StorageClassOutput)
			{
				bool is_masked = is_stage_output_variable_masked(*var);

				if (is_masked)
				{
					if (is_tessellation_shader())
						addr_space = "threadgroup";
					else
						addr_space = "thread";
				}
				else if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
					addr_space = "threadgroup";
			}

			if (!addr_space)
				addr_space = "device";
		}
		break;

	default:
		break;
	}

	if (!addr_space)
	{
		// No address space for plain values.
		addr_space = type.pointer || (argument && type.basetype == SPIRType::ControlPointArray) ? "thread" : "";
	}

	if (decoration_flags_signal_volatile(flags) && 0 != strcmp(addr_space, "thread"))
		return join("volatile ", addr_space);
	else
		return addr_space;
}